

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,TransactionContext *context)

{
  bool bVar1;
  UtxoData *in_RDX;
  uint32_t in_ESI;
  Psbt *in_RDI;
  TxInReference *txin;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *__range1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  value_type *in_stack_fffffffffffff9c8;
  UtxoData *in_stack_fffffffffffff9d0;
  Transaction *this_00;
  TransactionContext *in_stack_fffffffffffff9f8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffffb38;
  Psbt *in_stack_fffffffffffffb40;
  __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
  local_a8;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_a0;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *local_88;
  Transaction local_58;
  UtxoData *local_18;
  
  this_00 = &local_58;
  local_18 = in_RDX;
  core::Transaction::Transaction(this_00,(Transaction *)in_RDX);
  core::Psbt::Psbt(in_RDI,in_ESI,this_00);
  core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff9d0);
  in_RDI->_vptr_Psbt = (_func_int **)&PTR__Psbt_00b5c0d8;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x54868f);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x54869c);
  core::Transaction::GetTxInList(&local_a0,(Transaction *)local_18);
  local_88 = &local_a0;
  local_a8._M_current =
       (TxInReference *)
       std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::begin
                 (local_88);
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::end(local_88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                        *)in_stack_fffffffffffff9d0,
                       (__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                        *)in_stack_fffffffffffff9c8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
    ::operator*(&local_a8);
    in_stack_fffffffffffff9d0 = local_18;
    core::AbstractTxInReference::GetOutPoint((AbstractTxInReference *)in_stack_fffffffffffff9c8);
    TransactionContext::GetTxInUtxoData(in_stack_fffffffffffff9f8,(OutPoint *)this_00);
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    UtxoData::~UtxoData(in_stack_fffffffffffff9d0);
    core::OutPoint::~OutPoint((OutPoint *)0x5487cb);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
    ::operator++(&local_a8);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)in_RDI);
  CollectInputUtxo(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_RDI);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const TransactionContext& context)
    : cfd::core::Psbt(psbt_version, static_cast<const Transaction>(context)) {
  std::vector<UtxoData> utxo_list;
  for (const auto& txin : context.GetTxInList()) {
    utxo_list.push_back(context.GetTxInUtxoData(txin.GetOutPoint()));
  }
  CollectInputUtxo(utxo_list);
}